

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O3

parse_return __thiscall
msgpack::v2::detail::
context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::
start_aggregate<unsigned_int,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::array_sv,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::array_ev>
          (context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>
           *this,array_sv *sv,array_ev *ev,char *load_pos,size_t *off)

{
  pointer *pppoVar1;
  create_object_visitor *this_00;
  bool bVar2;
  parse_return pVar3;
  uint uVar4;
  
  uVar4 = *(uint *)load_pos;
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  this_00 = sv->m_visitor_holder->m_visitor;
  if (uVar4 == 0) {
    bVar2 = create_object_visitor::start_array(this_00,0);
    if (!bVar2) goto LAB_001676eb;
    pppoVar1 = &(ev->m_visitor_holder->m_visitor->m_stack).
                super__Vector_base<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppoVar1 = *pppoVar1 + -1;
    pVar3 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::consume
                      ((unpack_stack *)(this + 0x20),
                       (parse_helper<msgpack::v2::detail::create_object_visitor> *)this);
  }
  else {
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    bVar2 = create_object_visitor::start_array(this_00,uVar4);
    if (!bVar2) {
LAB_001676eb:
      *off = *(long *)(this + 8) - *(long *)this;
      return PARSE_STOP_VISITOR;
    }
    pVar3 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::push
                      ((unpack_stack *)(this + 0x20),
                       (parse_helper<msgpack::v2::detail::create_object_visitor> *)this,
                       MSGPACK_CT_ARRAY_ITEM,uVar4);
  }
  if (pVar3 == PARSE_CONTINUE) {
    *(undefined4 *)(this + 0x18) = 0;
    pVar3 = PARSE_CONTINUE;
  }
  else {
    *off = *(long *)(this + 8) - *(long *)this;
  }
  return pVar3;
}

Assistant:

parse_return start_aggregate(
        StartVisitor const& sv,
        EndVisitor const& ev,
        const char* load_pos,
        std::size_t& off) {
        typename value<T>::type size;
        load<T>(size, load_pos);
        ++m_current;
        if (size == 0) {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            if (!ev()) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.consume(holder());
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        else {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.push(holder(), sv.type(), static_cast<uint32_t>(size));
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        m_cs = MSGPACK_CS_HEADER;
        return PARSE_CONTINUE;
    }